

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Descriptor *pDVar3;
  int iVar4;
  int iVar5;
  Syntax SVar6;
  int iVar7;
  FileDescriptor *pFVar8;
  DescriptorPool *pDVar9;
  DescriptorPool *pDVar10;
  MessageFactory *pMVar11;
  undefined4 extraout_var;
  mapped_type pTVar12;
  ulong uVar13;
  FieldDescriptor *this_00;
  OneofDescriptor *pOVar14;
  uint *puVar15;
  char *pcVar16;
  DynamicMessage *this_01;
  int __c;
  Descriptor *in_RSI;
  DynamicMessageFactory *in_RDI;
  ReflectionSchema schema;
  DynamicMessage *prototype;
  void *base;
  int field_size_1;
  FieldDescriptor *field;
  int j;
  int i_3;
  int i_2;
  int field_size;
  int i_1;
  int num_weak_fields;
  int i;
  uint32 *has_bits_indices;
  int has_bits_array_size;
  int size;
  uint32 *offsets;
  TypeInfo *type_info;
  TypeInfo **target;
  pointer in_stack_fffffffffffffeb8;
  TypeInfo *in_stack_fffffffffffffec0;
  unique_ptr<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
  *this_02;
  Descriptor *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  Descriptor *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int in_stack_ffffffffffffff18;
  DescriptorPool *local_e0;
  void *in_stack_ffffffffffffff40;
  uint32 *in_stack_ffffffffffffff48;
  Descriptor *in_stack_ffffffffffffff50;
  int local_7c;
  FieldDescriptor *local_78;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  void *local_50;
  int local_48;
  int local_44;
  Descriptor *local_40;
  mapped_type local_28;
  mapped_type *local_20;
  Descriptor *local_18;
  DescriptorPool *local_8;
  
  local_18 = in_RSI;
  if ((in_RDI->delegate_to_generated_factory_ & 1U) != 0) {
    pFVar8 = Descriptor::file(in_RSI);
    pDVar9 = FileDescriptor::pool(pFVar8);
    pDVar10 = DescriptorPool::generated_pool();
    if (pDVar9 == pDVar10) {
      pMVar11 = MessageFactory::generated_factory();
      iVar4 = (*pMVar11->_vptr_MessageFactory[2])(pMVar11,local_18);
      return (Message *)CONCAT44(extraout_var,iVar4);
    }
  }
  std::
  unique_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
  ::operator->((unique_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
                *)0x5602fd);
  local_20 = std::
             unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
             ::operator[]((unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
                           *)in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->descriptor_);
  if (*local_20 == (mapped_type)0x0) {
    pTVar12 = (mapped_type)operator_new(0x58);
    DynamicMessage::TypeInfo::TypeInfo(in_stack_fffffffffffffec0);
    *local_20 = pTVar12;
    pTVar12->type = local_18;
    local_28 = pTVar12;
    if (in_RDI->pool_ == (DescriptorPool *)0x0) {
      pFVar8 = Descriptor::file(local_18);
      local_e0 = FileDescriptor::pool(pFVar8);
    }
    else {
      local_e0 = in_RDI->pool_;
    }
    local_28->pool = local_e0;
    local_28->factory = in_RDI;
    iVar4 = Descriptor::field_count(local_18);
    iVar5 = Descriptor::oneof_decl_count(local_18);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(iVar4 + iVar5);
    uVar13 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    local_40 = (Descriptor *)operator_new__(uVar13);
    std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::reset<unsigned_int*,void>
              ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
               in_stack_fffffffffffffec0,(uint *)in_stack_fffffffffffffeb8);
    local_44 = 0x20;
    local_44 = anon_unknown_0::AlignOffset(0);
    pFVar8 = Descriptor::file(local_18);
    SVar6 = FileDescriptor::syntax(pFVar8);
    if (SVar6 == SYNTAX_PROTO3) {
      local_28->has_bits_offset = -1;
    }
    else {
      local_28->has_bits_offset = local_44;
      iVar5 = Descriptor::field_count(local_18);
      local_48 = anon_unknown_0::DivideRoundingUp(iVar5,0x20);
      local_44 = local_44 + local_48 * 4;
      local_44 = anon_unknown_0::AlignOffset(0);
      iVar5 = Descriptor::field_count(local_18);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)iVar5;
      uVar13 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar13 = 0xffffffffffffffff;
      }
      local_50 = operator_new__(uVar13);
      local_54 = 0;
      while (in_stack_ffffffffffffff18 = local_54, iVar5 = Descriptor::field_count(local_18),
            in_stack_ffffffffffffff18 < iVar5) {
        *(int *)((long)local_50 + (long)local_54 * 4) = local_54;
        local_54 = local_54 + 1;
      }
      std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::reset<unsigned_int*,void>
                ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                 in_stack_fffffffffffffec0,(uint *)in_stack_fffffffffffffeb8);
    }
    iVar5 = Descriptor::oneof_decl_count(local_18);
    if (0 < iVar5) {
      local_28->oneof_case_offset = local_44;
      iVar5 = Descriptor::oneof_decl_count(local_18);
      local_44 = local_44 + iVar5 * 4;
      local_44 = anon_unknown_0::AlignOffset(0);
    }
    iVar5 = Descriptor::extension_range_count(local_18);
    if (iVar5 < 1) {
      local_28->extensions_offset = -1;
    }
    else {
      local_28->extensions_offset = local_44;
      local_44 = local_44 + 0x18;
      local_44 = anon_unknown_0::AlignOffset(0);
    }
    local_58 = 0;
    for (local_5c = 0; iVar5 = local_5c, iVar7 = Descriptor::field_count(local_18), iVar5 < iVar7;
        local_5c = local_5c + 1) {
      this_00 = Descriptor::field(local_18,local_5c);
      pOVar14 = FieldDescriptor::containing_oneof(this_00);
      if (pOVar14 == (OneofDescriptor *)0x0) {
        Descriptor::field(local_18,local_5c);
        local_60 = anon_unknown_0::FieldSpaceUsed
                             ((FieldDescriptor *)CONCAT44(iVar4,in_stack_ffffffffffffff18));
        std::min<int>(&(anonymous_namespace)::kSafeAlignment,&local_60);
        local_44 = anon_unknown_0::AlignTo(0,0x56073e);
        *(int *)(local_40 + (long)local_5c * 4) = local_44;
        local_44 = local_60 + local_44;
      }
    }
    for (local_64 = 0; iVar5 = local_64, iVar7 = Descriptor::oneof_decl_count(local_18),
        iVar5 < iVar7; local_64 = local_64 + 1) {
      iVar5 = anon_unknown_0::AlignTo(0,0x5607ca);
      pDVar3 = local_40;
      local_44 = iVar5;
      iVar7 = Descriptor::field_count(local_18);
      *(int *)(pDVar3 + (long)(iVar7 + local_64) * 4) = iVar5;
      local_44 = local_44 + 8;
    }
    local_44 = anon_unknown_0::AlignOffset(0);
    local_28->internal_metadata_offset = local_44;
    local_44 = local_44 + 8;
    local_28->weak_field_map_offset = -1;
    local_28->size = local_44;
    iVar5 = Descriptor::oneof_decl_count(local_18);
    if (0 < iVar5) {
      for (local_68 = 0; iVar5 = local_68, iVar7 = Descriptor::oneof_decl_count(local_18),
          iVar5 < iVar7; local_68 = local_68 + 1) {
        local_6c = 0;
        while( true ) {
          in_stack_fffffffffffffef4 = local_6c;
          pOVar14 = Descriptor::oneof_decl(local_18,local_68);
          iVar5 = OneofDescriptor::field_count(pOVar14);
          if (iVar5 <= in_stack_fffffffffffffef4) break;
          pOVar14 = Descriptor::oneof_decl(local_18,local_68);
          local_78 = OneofDescriptor::field(pOVar14,local_6c);
          local_7c = anon_unknown_0::OneofFieldSpaceUsed
                               ((FieldDescriptor *)CONCAT44(iVar4,in_stack_ffffffffffffff18));
          in_stack_fffffffffffffee0 = local_44;
          puVar15 = (uint *)std::min<int>(&(anonymous_namespace)::kSafeAlignment,&local_7c);
          pcVar16 = (char *)(ulong)*puVar15;
          in_stack_fffffffffffffee4 = anon_unknown_0::AlignTo(0,0x56097d);
          in_stack_fffffffffffffee8 = local_40;
          local_44 = in_stack_fffffffffffffee4;
          pcVar16 = FieldDescriptor::index(local_78,pcVar16,__c);
          *(int *)(in_stack_fffffffffffffee8 + (long)(int)pcVar16 * 4) = in_stack_fffffffffffffee4;
          local_44 = local_7c + local_44;
          local_6c = local_6c + 1;
        }
      }
    }
    local_44 = anon_unknown_0::AlignOffset(0);
    pDVar10 = (DescriptorPool *)operator_new((long)local_44);
    memset(pDVar10,0,(long)local_44);
    DynamicMessage::DynamicMessage
              ((DynamicMessage *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (TypeInfo *)pDVar10,SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0));
    pDVar9 = pDVar10;
    iVar4 = Descriptor::oneof_decl_count(local_18);
    if ((0 < iVar4) || (0 < local_58)) {
      in_stack_fffffffffffffed0 = local_28->type;
      std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                 in_stack_fffffffffffffec0);
      ConstructDefaultOneofInstance
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    }
    std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
              ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
               in_stack_fffffffffffffec0);
    this_01 = (DynamicMessage *)
              std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                        ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                         in_stack_fffffffffffffec0);
    this_02 = &local_28->reflection;
    operator_new(0x50);
    Reflection::Reflection
              ((Reflection *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8,
               (ReflectionSchema *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               pDVar9,(MessageFactory *)in_stack_fffffffffffffed0);
    std::
    unique_ptr<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
    ::reset(this_02,in_stack_fffffffffffffeb8);
    DynamicMessage::CrossLinkPrototypes(this_01);
    local_8 = pDVar10;
  }
  else {
    local_8 = (DescriptorPool *)(*local_20)->prototype;
  }
  return (Message *)local_8;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    return MessageFactory::generated_factory()->GetPrototype(type);
  }

  const DynamicMessage::TypeInfo** target = &prototypes_->map_[type];
  if (*target != NULL) {
    // Already exists.
    return (*target)->prototype;
  }

  DynamicMessage::TypeInfo* type_info = new DynamicMessage::TypeInfo;
  *target = type_info;

  type_info->type = type;
  type_info->pool = (pool_ == NULL) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to Reflection's constructor.
  // This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.

  // Compute size and offsets.
  uint32* offsets = new uint32[type->field_count() + type->oneof_decl_count()];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  if (type->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    type_info->has_bits_offset = -1;
  } else {
    type_info->has_bits_offset = size;
    int has_bits_array_size =
        DivideRoundingUp(type->field_count(), bitsizeof(uint32));
    size += has_bits_array_size * sizeof(uint32);
    size = AlignOffset(size);

    uint32* has_bits_indices = new uint32[type->field_count()];
    for (int i = 0; i < type->field_count(); i++) {
      has_bits_indices[i] = i;
    }
    type_info->has_bits_indices.reset(has_bits_indices);
  }

  // The oneof_case, if any. It is an array of uint32s.
  if (type->oneof_decl_count() > 0) {
    type_info->oneof_case_offset = size;
    size += type->oneof_decl_count() * sizeof(uint32);
    size = AlignOffset(size);
  }

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  //
  // TODO(b/31226269):  Optimize the order of fields to minimize padding.
  int num_weak_fields = 0;
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    // Oneof fields do not use any space.
    if (!type->field(i)->containing_oneof()) {
      int field_size = FieldSpaceUsed(type->field(i));
      size = AlignTo(size, std::min(kSafeAlignment, field_size));
      offsets[i] = size;
      size += field_size;
    }
  }

  // The oneofs.
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    size = AlignTo(size, kSafeAlignment);
    offsets[type->field_count() + i] = size;
    size += kMaxOneofUnionSize;
  }

  // Add the InternalMetadataWithArena to the end.
  size = AlignOffset(size);
  type_info->internal_metadata_offset = size;
  size += sizeof(InternalMetadataWithArena);

  type_info->weak_field_map_offset = -1;

  // Align the final size to make sure no clever allocators think that
  // alignment is not necessary.
  type_info->size = size;

  // Construct the reflection object.

  if (type->oneof_decl_count() > 0) {
    // Compute the size of default oneof instance and offsets of default
    // oneof fields.
    for (int i = 0; i < type->oneof_decl_count(); i++) {
      for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
        const FieldDescriptor* field = type->oneof_decl(i)->field(j);
        int field_size = OneofFieldSpaceUsed(field);
        size = AlignTo(size, std::min(kSafeAlignment, field_size));
        offsets[field->index()] = size;
        size += field_size;
      }
    }
  }
  size = AlignOffset(size);
  // Allocate the prototype + oneof fields.
  void* base = operator new(size);
  memset(base, 0, size);

  // We have already locked the factory so we should not lock in the constructor
  // of dynamic message to avoid dead lock.
  DynamicMessage* prototype = new (base) DynamicMessage(type_info, false);

  if (type->oneof_decl_count() > 0 || num_weak_fields > 0) {
    // Construct default oneof instance.
    ConstructDefaultOneofInstance(type_info->type, type_info->offsets.get(),
                                  prototype);
  }

  internal::ReflectionSchema schema = {type_info->prototype,
                                       type_info->offsets.get(),
                                       type_info->has_bits_indices.get(),
                                       type_info->has_bits_offset,
                                       type_info->internal_metadata_offset,
                                       type_info->extensions_offset,
                                       type_info->oneof_case_offset,
                                       type_info->size,
                                       type_info->weak_field_map_offset};

  type_info->reflection.reset(
      new Reflection(type_info->type, schema, type_info->pool, this));

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}